

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_3_statementlist(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_3_statementlist(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define s2 G->val[-1]
#define s1 G->val[-2]
  yyprintf((stderr, "do yy_3_statementlist"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy=NOP(); }\n"));
  yy=NOP(); ;
#undef s2
#undef s1
}